

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varlist.cc
# Opt level: O2

void __thiscall VariableList::InitFunctions(VariableList *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"ABS",&local_29);
  InitOneFunction(this,&local_28,"fabs",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ABS%",&local_29);
  InitOneFunction(this,&local_28,"abs",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ASC",&local_29);
  InitOneFunction(this,&local_28,"basic::Ascii",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ASCII",&local_29);
  InitOneFunction(this,&local_28,"basic::Ascii",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ATN",&local_29);
  InitOneFunction(this,&local_28,"atan",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"BUFSIZ",&local_29);
  InitOneFunction(this,&local_28,"basic::Bufsiz",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CCPOS",&local_29);
  InitOneFunction(this,&local_28,"basic::Ccpos",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CHR$",&local_29);
  InitOneFunction(this,&local_28,"basic::Char",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"COMP%",&local_29);
  InitOneFunction(this,&local_28,"basic::Comp",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"COS",&local_29);
  InitOneFunction(this,&local_28,"cos",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CTRLC",&local_29);
  InitOneFunction(this,&local_28,"basic::ctrlc()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CVT$%",&local_29);
  InitOneFunction(this,&local_28,"basic::cvtai",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CVT%$",&local_29);
  InitOneFunction(this,&local_28,"basic::cvtia",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CVT$F",&local_29);
  InitOneFunction(this,&local_28,"basic::cvtaf",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CVTF$",&local_29);
  InitOneFunction(this,&local_28,"basic::cvtfa",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CVT$$",&local_29);
  InitOneFunction(this,&local_28,"basic::edit",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"DATE$",&local_29);
  InitOneFunction(this,&local_28,"basic::Qdate",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"DET",&local_29);
  InitOneFunction(this,&local_28,"basic::det()",VARTYPE_DOUBLE,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"DIF$",&local_29);
  InitOneFunction(this,&local_28,"basic::Dif",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ECHO",&local_29);
  InitOneFunction(this,&local_28,"basic::Echo",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"EDIT$",&local_29);
  InitOneFunction(this,&local_28,"basic::edit",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ERR",&local_29);
  InitOneFunction(this,&local_28,"Be.err",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ERL",&local_29);
  InitOneFunction(this,&local_28,"Be.erl",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ERN$",&local_29);
  InitOneFunction(this,&local_28,"Be.ern",VARTYPE_DYNSTR,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ERT$",&local_29);
  InitOneFunction(this,&local_28,"basic::ert",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"EXP",&local_29);
  InitOneFunction(this,&local_28,"basic::exp",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"FIX",&local_29);
  InitOneFunction(this,&local_28,"trunc",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"FORMAT$",&local_29);
  InitOneFunction(this,&local_28,"basic::Format",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"FSP$",&local_29);
  InitOneFunction(this,&local_28,"basic::Fsp",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"FSS$",&local_29);
  InitOneFunction(this,&local_28,"basic::Fss",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"GETRFA",&local_29);
  InitOneFunction(this,&local_28,"basic::Getrfa",VARTYPE_RFA,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"INKEY$",&local_29);
  InitOneFunction(this,&local_28,"basic::Inkey",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"INSTR",&local_29);
  InitOneFunction(this,&local_28,"basic::instr",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"INT",&local_29);
  InitOneFunction(this,&local_28,"floor",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"LEFT",&local_29);
  InitOneFunction(this,&local_28,"basic::left",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"LEFT$",&local_29);
  InitOneFunction(this,&local_28,"basic::left",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"LEN",&local_29);
  InitOneFunction(this,&local_28,"basic::strlen",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"LOC",&local_29);
  InitOneFunction(this,&local_28,"&",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"LOG",&local_29);
  InitOneFunction(this,&local_28,"log",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"LOG10",&local_29);
  InitOneFunction(this,&local_28,"log10",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"MAG",&local_29);
  InitOneFunction(this,&local_28,"basic::Mag",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"MAGTAPE",&local_29);
  InitOneFunction(this,&local_28,"basic::Magtape",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"MAR",&local_29);
  InitOneFunction(this,&local_28,"basic::Mar",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"MID",&local_29);
  InitOneFunction(this,&local_28,"basic::mid",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"MID$",&local_29);
  InitOneFunction(this,&local_28,"basic::mid",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"NOECHO",&local_29);
  InitOneFunction(this,&local_28,"basic::NoEcho",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"NUM",&local_29);
  InitOneFunction(this,&local_28,"basic::num()",VARTYPE_DOUBLE,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"NUM2",&local_29);
  InitOneFunction(this,&local_28,"basic::num2()",VARTYPE_DOUBLE,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"NUM$",&local_29);
  InitOneFunction(this,&local_28,"basic::Qnum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"NUM1$",&local_29);
  InitOneFunction(this,&local_28,"std::to_string",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ONECHR",&local_29);
  InitOneFunction(this,&local_28,"basic::OneChr",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"PLACE$",&local_29);
  InitOneFunction(this,&local_28,"basic::Place",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"POS",&local_29);
  InitOneFunction(this,&local_28,"basic::Ccpos",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"PROD$",&local_29);
  InitOneFunction(this,&local_28,"basic::Prod",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"QUO$",&local_29);
  InitOneFunction(this,&local_28,"basic::Quo",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"RAD$",&local_29);
  InitOneFunction(this,&local_28,"basic::Qrad",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"RCTLC",&local_29);
  InitOneFunction(this,&local_28,"basic::rctlc()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"RCTLO",&local_29);
  InitOneFunction(this,&local_28,"basic::rctlo()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"RECOUNT",&local_29);
  InitOneFunction(this,&local_28,"basic::recount()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"RIGHT",&local_29);
  InitOneFunction(this,&local_28,"basic::right",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"RIGHT$",&local_29);
  InitOneFunction(this,&local_28,"basic::right",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"RND",&local_29);
  InitOneFunction(this,&local_28,"basic::floatrand",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"RND",&local_29);
  InitOneFunction(this,&local_28,"basic::floatrand()",VARTYPE_DOUBLE,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SEG$",&local_29);
  InitOneFunction(this,&local_28,"basic::Qseg",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SGN",&local_29);
  InitOneFunction(this,&local_28,"basic::sgn",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SIN",&local_29);
  InitOneFunction(this,&local_28,"sin",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SPACE$",&local_29);
  InitOneFunction(this,&local_28,"basic::Qspace",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SQRT",&local_29);
  InitOneFunction(this,&local_28,"sqrt",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SQR",&local_29);
  InitOneFunction(this,&local_28,"sqrt",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"STATUS",&local_29);
  InitOneFunction(this,&local_28,"basic::status()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"STR$",&local_29);
  InitOneFunction(this,&local_28,"basic::Qnum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"STRING$",&local_29);
  InitOneFunction(this,&local_28,"basic::Qstring",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"STR$FIND_FIRST_IN_SET",&local_29);
  InitOneFunction(this,&local_28,"str$find_first_in_set",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SUM$",&local_29);
  InitOneFunction(this,&local_28,"basic::Sum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SWAP%",&local_29);
  InitOneFunction(this,&local_28,"basic::Swap",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"SYS",&local_29);
  InitOneFunction(this,&local_28,"basic::sys",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"TAB",&local_29);
  InitOneFunction(this,&local_28,"Tab",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"TAN",&local_29);
  InitOneFunction(this,&local_28,"tan",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"TIME",&local_29);
  InitOneFunction(this,&local_28,"basic::Time",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"TIME$",&local_29);
  InitOneFunction(this,&local_28,"basic::Qtime",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"TRM$",&local_29);
  InitOneFunction(this,&local_28,"boost::trim_right_copy",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"VAL",&local_29);
  InitOneFunction(this,&local_28,"std::stod",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"VAL%",&local_29);
  InitOneFunction(this,&local_28,"std::stol",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"XLATE",&local_29);
  InitOneFunction(this,&local_28,"basic::Xlate",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"LIB$SIGNAL",&local_29);
  InitOneFunction(this,&local_28,"exit",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void VariableList::InitFunctions(void)
{
	InitOneFunction("ABS",		"fabs",			VARTYPE_DOUBLE);
	InitOneFunction("ABS%",		"abs",			VARTYPE_DOUBLE);
	InitOneFunction("ASC",		"basic::Ascii",		VARTYPE_LONG);
	InitOneFunction("ASCII",	"basic::Ascii",		VARTYPE_LONG);
	InitOneFunction("ATN",		"atan",			VARTYPE_DOUBLE);
	InitOneFunction("BUFSIZ",	"basic::Bufsiz",	VARTYPE_LONG);
	InitOneFunction("CCPOS",	"basic::Ccpos",		VARTYPE_LONG);
	InitOneFunction("CHR$",		"basic::Char",		VARTYPE_DYNSTR);
	InitOneFunction("COMP%",	"basic::Comp",		VARTYPE_LONG);
	InitOneFunction("COS",		"cos",			VARTYPE_DOUBLE);
	InitOneFunction("CTRLC",	"basic::ctrlc()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("CVT$%",	"basic::cvtai",		VARTYPE_LONG);
	InitOneFunction("CVT%$",	"basic::cvtia",		VARTYPE_DYNSTR);
	InitOneFunction("CVT$F",	"basic::cvtaf",		VARTYPE_DOUBLE);
	InitOneFunction("CVTF$",	"basic::cvtfa",		VARTYPE_DYNSTR);
	InitOneFunction("CVT$$",	"basic::edit",		VARTYPE_DYNSTR);
	InitOneFunction("DATE$",	"basic::Qdate",		VARTYPE_DYNSTR);
	InitOneFunction("DET",		"basic::det()",		VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("DIF$",		"basic::Dif",		VARTYPE_DYNSTR);
	InitOneFunction("ECHO",		"basic::Echo",		VARTYPE_LONG);
	InitOneFunction("EDIT$",	"basic::edit",		VARTYPE_DYNSTR);
	InitOneFunction("ERR",		"Be.err",		VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("ERL",		"Be.erl",		VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("ERN$",		"Be.ern",		VARTYPE_DYNSTR, VARCLASS_NONE);
	InitOneFunction("ERT$",		"basic::ert",		VARTYPE_DYNSTR);
	InitOneFunction("EXP",		"basic::exp",		VARTYPE_DOUBLE);
	InitOneFunction("FIX",		"trunc",		VARTYPE_DOUBLE);
	InitOneFunction("FORMAT$",	"basic::Format",	VARTYPE_DYNSTR);
	InitOneFunction("FSP$",		"basic::Fsp",		VARTYPE_DYNSTR);
	InitOneFunction("FSS$",		"basic::Fss",		VARTYPE_DYNSTR);
	InitOneFunction("GETRFA",	"basic::Getrfa",	VARTYPE_RFA);
	InitOneFunction("INKEY$",	"basic::Inkey",		VARTYPE_DYNSTR);
	InitOneFunction("INSTR",	"basic::instr",		VARTYPE_LONG);
	InitOneFunction("INT",		"floor",		VARTYPE_DOUBLE);
	InitOneFunction("LEFT",		"basic::left",		VARTYPE_DYNSTR);
	InitOneFunction("LEFT$",	"basic::left",		VARTYPE_DYNSTR);
	InitOneFunction("LEN",		"basic::strlen",	VARTYPE_LONG);
	InitOneFunction("LOC",		"&",			VARTYPE_LONG);
	InitOneFunction("LOG",		"log",			VARTYPE_DOUBLE);
	InitOneFunction("LOG10",	"log10",		VARTYPE_DOUBLE);
	InitOneFunction("MAG",		"basic::Mag",		VARTYPE_DOUBLE);
	InitOneFunction("MAGTAPE",	"basic::Magtape",	VARTYPE_LONG);
	InitOneFunction("MAR",		"basic::Mar",		VARTYPE_LONG);
	InitOneFunction("MID",		"basic::mid",		VARTYPE_DYNSTR);
	InitOneFunction("MID$",		"basic::mid",		VARTYPE_DYNSTR);
	InitOneFunction("NOECHO",	"basic::NoEcho",	VARTYPE_LONG);
	InitOneFunction("NUM",		"basic::num()",		VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("NUM2",		"basic::num2()",	VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("NUM$",		"basic::Qnum",		VARTYPE_DYNSTR);
	InitOneFunction("NUM1$",	"std::to_string",	VARTYPE_DYNSTR);
	InitOneFunction("ONECHR",	"basic::OneChr",	VARTYPE_LONG);
	InitOneFunction("PLACE$",	"basic::Place",		VARTYPE_DYNSTR);
	InitOneFunction("POS",		"basic::Ccpos",		VARTYPE_LONG);
	InitOneFunction("PROD$",	"basic::Prod",		VARTYPE_DYNSTR);
	InitOneFunction("QUO$",		"basic::Quo",		VARTYPE_DYNSTR);
	InitOneFunction("RAD$",		"basic::Qrad",		VARTYPE_DYNSTR);
	InitOneFunction("RCTLC",	"basic::rctlc()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RCTLO",	"basic::rctlo()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RECOUNT",	"basic::recount()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RIGHT",	"basic::right",		VARTYPE_DYNSTR);
	InitOneFunction("RIGHT$",	"basic::right",		VARTYPE_DYNSTR);
	InitOneFunction("RND",		"basic::floatrand",	VARTYPE_DOUBLE);
	InitOneFunction("RND",		"basic::floatrand()",	VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("SEG$",		"basic::Qseg",		VARTYPE_DYNSTR);
	InitOneFunction("SGN",		"basic::sgn",		VARTYPE_LONG);
	InitOneFunction("SIN",		"sin",			VARTYPE_DOUBLE);
	InitOneFunction("SPACE$",	"basic::Qspace",	VARTYPE_DYNSTR);
	InitOneFunction("SQRT",		"sqrt",			VARTYPE_DOUBLE);
	InitOneFunction("SQR",		"sqrt",			VARTYPE_DOUBLE);
	InitOneFunction("STATUS",	"basic::status()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("STR$",		"basic::Qnum",		VARTYPE_DYNSTR);
	InitOneFunction("STRING$",	"basic::Qstring",	VARTYPE_DYNSTR);
	InitOneFunction("STR$FIND_FIRST_IN_SET",
					"str$find_first_in_set",VARTYPE_DYNSTR);
	InitOneFunction("SUM$",		"basic::Sum",		VARTYPE_DYNSTR);
	InitOneFunction("SWAP%",	"basic::Swap",		VARTYPE_LONG);
	InitOneFunction("SYS",		"basic::sys",		VARTYPE_DYNSTR);
	InitOneFunction("TAB",		"Tab",			VARTYPE_DYNSTR);
	InitOneFunction("TAN",		"tan",			VARTYPE_DOUBLE);
	InitOneFunction("TIME",		"basic::Time",		VARTYPE_DOUBLE);
	InitOneFunction("TIME$",	"basic::Qtime",		VARTYPE_DYNSTR);
	InitOneFunction("TRM$",		"boost::trim_right_copy",	VARTYPE_DYNSTR);
	InitOneFunction("VAL",		"std::stod",		VARTYPE_DOUBLE);
	InitOneFunction("VAL%",		"std::stol",		VARTYPE_LONG);
	InitOneFunction("XLATE",	"basic::Xlate",		VARTYPE_DYNSTR);
	InitOneFunction("LIB$SIGNAL",	"exit",			VARTYPE_LONG);
}